

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O3

boolean m_slips_free(monst *mdef,attack *mattk)

{
  uint uVar1;
  obj *obj;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  long flag;
  char *pcVar5;
  
  flag = 4;
  if (mattk->adtyp != ' ') {
    obj = which_armor(mdef,2);
    if ((obj != (obj *)0x0) || (obj = which_armor(mdef,1), obj != (obj *)0x0)) goto LAB_0027a6da;
    flag = 0x40;
  }
  obj = which_armor(mdef,flag);
  if (obj == (obj *)0x0) {
    return '\0';
  }
LAB_0027a6da:
  if ((((*(uint *)&obj->field_0x4a >> 0x14 & 1) == 0) && (obj->otyp != 0x80)) ||
     (((*(uint *)&obj->field_0x4a & 1) != 0 &&
      (uVar1 = mt_random(), uVar1 * -0x55555555 < 0x55555556)))) {
    return '\0';
  }
  pcVar5 = "grab, but cannot hold onto";
  if (mattk->adtyp == '\x1c') {
    pcVar5 = "slip off of";
  }
  pcVar2 = mon_nam(mdef);
  pcVar3 = s_suffix(pcVar2);
  pcVar2 = "greased";
  if (((*(uint *)&obj->field_0x4a & 0x100000) == 0) &&
     (pcVar2 = "slippery", (objects[obj->otyp].field_0x10 & 1) == 0)) {
    pcVar4 = cloak_simple_name(obj);
  }
  else {
    pcVar4 = xname(obj);
  }
  pline("You %s %s %s %s!",pcVar5,pcVar3,pcVar2,pcVar4);
  if ((obj->field_0x4c & 0x10) != 0) {
    uVar1 = mt_random();
    if ((uVar1 & 1) == 0) {
      pline("The grease wears off.");
      obj->field_0x4c = obj->field_0x4c & 0xef;
      return '\x01';
    }
    return '\x01';
  }
  return '\x01';
}

Assistant:

static boolean m_slips_free(struct monst *mdef, const struct attack *mattk)
{
	struct obj *obj;

	if (mattk->adtyp == AD_DRIN) {
	    /* intelligence drain attacks the head */
	    obj = which_armor(mdef, W_ARMH);
	} else {
	    /* grabbing attacks the body */
	    obj = which_armor(mdef, W_ARMC);		/* cloak */
	    if (!obj) obj = which_armor(mdef, W_ARM);	/* suit */
	    if (!obj) obj = which_armor(mdef, W_ARMU);	/* shirt */
	}

	/* if your cloak/armor is greased, monster slips off; this
	   protection might fail (33% chance) when the armor is cursed */
	if (obj && (obj->greased || obj->otyp == OILSKIN_CLOAK) &&
		(!obj->cursed || rn2(3))) {
	    pline("You %s %s %s %s!",
		mattk->adtyp == AD_WRAP ?
			"slip off of" : "grab, but cannot hold onto",
		s_suffix(mon_nam(mdef)),
		obj->greased ? "greased" : "slippery",
		/* avoid "slippery slippery cloak"
		   for undiscovered oilskin cloak */
		(obj->greased || objects[obj->otyp].oc_name_known) ?
			xname(obj) : cloak_simple_name(obj));

	    if (obj->greased && !rn2(2)) {
		pline("The grease wears off.");
		obj->greased = 0;
	    }
	    return TRUE;
	}
	return FALSE;
}